

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

void report_failed_pipeline(void)

{
  PerThreadData *pPVar1;
  uint index_2;
  uint index_1;
  uint index;
  PerThreadData *per_thread;
  
  if (global_replayer != (ThreadedReplayer *)0x0) {
    pPVar1 = ThreadedReplayer::get_per_thread_data(global_replayer);
    if (pPVar1->current_graphics_pipeline == 0) {
      if (pPVar1->current_compute_pipeline == 0) {
        if (pPVar1->current_raytracing_pipeline != 0) {
          fprintf(_stderr,
                  "Fossilize ERROR: Raytracing pipeline crashed or hung, hash: %016lx. Rerun with: --raytracing-pipeline-range %u %u.\n"
                  ,pPVar1->current_raytracing_pipeline,(ulong)(pPVar1->current_raytracing_index - 1)
                  ,(ulong)pPVar1->current_raytracing_index);
          fflush(_stderr);
        }
      }
      else {
        fprintf(_stderr,
                "Fossilize ERROR: Compute pipeline crashed or hung, hash: %016lx. Rerun with: --compute-pipeline-range %u %u.\n"
                ,pPVar1->current_compute_pipeline,(ulong)(pPVar1->current_compute_index - 1),
                (ulong)pPVar1->current_compute_index);
        fflush(_stderr);
      }
    }
    else {
      fprintf(_stderr,
              "Fossilize ERROR: Graphics pipeline crashed or hung: %016lx. Rerun with: --graphics-pipeline-range %u %u.\n"
              ,pPVar1->current_graphics_pipeline,(ulong)(pPVar1->current_graphics_index - 1),
              (ulong)pPVar1->current_graphics_index);
      fflush(_stderr);
    }
  }
  return;
}

Assistant:

static void report_failed_pipeline()
{
	if (global_replayer)
	{
		auto *per_thread = &global_replayer->get_per_thread_data();

		if (per_thread->current_graphics_pipeline)
		{
			unsigned index = per_thread->current_graphics_index - 1;
			LOGE("Graphics pipeline crashed or hung: %016" PRIx64 ". Rerun with: --graphics-pipeline-range %u %u.\n",
			     per_thread->current_graphics_pipeline, index, index + 1);
		}
		else if (per_thread->current_compute_pipeline)
		{
			unsigned index = per_thread->current_compute_index - 1;
			LOGE("Compute pipeline crashed or hung, hash: %016" PRIx64 ". Rerun with: --compute-pipeline-range %u %u.\n",
			     per_thread->current_compute_pipeline, index, index + 1);
		}
		else if (per_thread->current_raytracing_pipeline)
		{
			unsigned index = per_thread->current_raytracing_index - 1;
			LOGE("Raytracing pipeline crashed or hung, hash: %016" PRIx64 ". Rerun with: --raytracing-pipeline-range %u %u.\n",
			     per_thread->current_raytracing_pipeline, index, index + 1);
		}
	}
}